

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SField.cpp
# Opt level: O3

SField * jbcoin::SField::getField(string *fieldName)

{
  pointer pcVar1;
  size_t sVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  SField *pSVar5;
  
  if (knownCodeToField._24_8_ != 0x2ddb98) {
    pcVar1 = (fieldName->_M_dataplus)._M_p;
    sVar2 = fieldName->_M_string_length;
    p_Var4 = (_Rb_tree_node_base *)knownCodeToField._24_8_;
    do {
      pSVar5 = (SField *)p_Var4[1]._M_parent;
      if ((pSVar5->fieldName)._M_string_length == sVar2) {
        if (sVar2 == 0) {
          return pSVar5;
        }
        iVar3 = bcmp((pSVar5->fieldName)._M_dataplus._M_p,pcVar1,sVar2);
        if (iVar3 == 0) {
          return pSVar5;
        }
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)(knownCodeToField + 8));
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)SField_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (unknownCodeToField._24_8_ != 0x2ddbc8) {
    pcVar1 = (fieldName->_M_dataplus)._M_p;
    sVar2 = fieldName->_M_string_length;
    p_Var4 = (_Rb_tree_node_base *)unknownCodeToField._24_8_;
    do {
      pSVar5 = (SField *)p_Var4[1]._M_parent;
      if (((pSVar5->fieldName)._M_string_length == sVar2) &&
         ((sVar2 == 0 ||
          (iVar3 = bcmp((pSVar5->fieldName)._M_dataplus._M_p,pcVar1,sVar2), iVar3 == 0))))
      goto LAB_001ab970;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)(unknownCodeToField + 8));
  }
  pSVar5 = (SField *)&sfInvalid;
LAB_001ab970:
  pthread_mutex_unlock((pthread_mutex_t *)SField_mutex);
  return pSVar5;
}

Assistant:

SField const&
SField::getField (std::string const& fieldName)
{
    for (auto const & fieldPair : knownCodeToField)
    {
        if (fieldPair.second->fieldName == fieldName)
            return * (fieldPair.second);
    }
    {
        StaticScopedLockType sl (SField_mutex);

        for (auto const & fieldPair : unknownCodeToField)
        {
            if (fieldPair.second->fieldName == fieldName)
                return * (fieldPair.second);
        }
    }
    return sfInvalid;
}